

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

Matrix<double,_2,_3> * tcu::operator*(Matrix<double,_2,_1> *a,Matrix<double,_1,_3> *b)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  Matrix<double,_2,_3> *res;
  double *in_RDI;
  double *pdVar5;
  long lVar6;
  bool bVar7;
  undefined8 uVar8;
  
  pdVar2 = in_RDI;
  in_RDI[4] = 0.0;
  in_RDI[5] = 0.0;
  in_RDI[2] = 0.0;
  in_RDI[3] = 0.0;
  *in_RDI = 0.0;
  in_RDI[1] = 0.0;
  lVar3 = 0;
  pdVar5 = in_RDI;
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      uVar8 = 0x3ff0000000000000;
      if (lVar3 != lVar6) {
        uVar8 = 0;
      }
      *(undefined8 *)((long)pdVar5 + lVar6) = uVar8;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x30);
    pdVar5 = pdVar5 + 1;
    lVar3 = lVar3 + 0x10;
    bVar7 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar7);
  lVar4 = 0;
  do {
    dVar1 = (a->m_data).m_data[0].m_data[lVar4];
    lVar3 = 0;
    do {
      *(double *)((long)in_RDI + lVar3 * 2) =
           *(double *)((long)(b->m_data).m_data[0].m_data + lVar3) * dVar1 + 0.0;
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x18);
    in_RDI = in_RDI + 1;
    bVar7 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar7);
  return (Matrix<double,_2,_3> *)pdVar2;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}